

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O3

bool gutil::skip(istream *in,char *expected)

{
  int iVar1;
  string s;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    local_38 = 0;
    local_30[0] = 0;
    local_40 = local_30;
    std::operator>>(in,(string *)&local_40);
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 != 0) {
      std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    if (iVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool gutil::skip(std::istream &in, const char *expected)
{
  if (in.good())
  {
    std::string s;
    in >> s;

    if (s == expected)
    {
      return true;
    }

#ifndef NDEBUG
    std::cerr << "gutil::skip() expected '" << expected << "' but got '" << s << "'" << std::endl;
#endif

    in.setstate(std::ios_base::failbit);
  }

  return false;
}